

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_setup.cpp
# Opt level: O2

void PeleLM::rhoydotSetUp(void)

{
  int indx;
  ostream *os_;
  Print *pPVar1;
  ostringstream *this;
  long lVar2;
  int i;
  long lVar3;
  allocator local_239;
  BCRec bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string name;
  code *local_1d8 [2];
  code *local_1c8;
  code *local_1c0;
  BndryFunc pelelm_bndryfunc;
  
  RhoYdot_Type = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
  os_ = amrex::OutStream();
  amrex::Print::Print((Print *)&pelelm_bndryfunc,os_);
  std::operator<<((ostream *)&pelelm_bndryfunc.m_func3D,"RhoYdot_Type, nrhoydot = ");
  pPVar1 = amrex::Print::operator<<((Print *)&pelelm_bndryfunc,&RhoYdot_Type);
  this = &pPVar1->ss;
  std::operator<<((ostream *)this,' ');
  std::ostream::operator<<(this,9);
  std::operator<<((ostream *)this,'\n');
  amrex::Print::~Print((Print *)&pelelm_bndryfunc);
  amrex::DescriptorList::addDescriptor
            ((DescriptorList *)amrex::AmrLevel::desc_lst,RhoYdot_Type,(IndexType)0x0,Point,1,9,
             (InterpBase *)amrex::eb_mf_cell_cons_interp,false,true);
  local_1d8[1] = (code *)0x0;
  local_1d8[0] = pelelm_dummy_fill;
  local_1c0 = std::
              _Function_handler<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int),_void_(*)(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int),_void_(*)(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
              ::_M_manager;
  amrex::StateDescriptor::BndryFunc::BndryFunc(&pelelm_bndryfunc,(BndryFuncFabDefault *)local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)local_1d8);
  pelelm_bndryfunc.m_run_on_gpu = true;
  bc.bc[0] = -0x29a;
  bc.bc[1] = -0x29a;
  bc.bc[2] = -0x29a;
  bc.bc[3] = -0x29a;
  bc.bc[4] = -0x29a;
  bc.bc[5] = -0x29a;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    bc.bc[lVar3] = rhoydot_bc[NavierStokesBase::phys_bc.bc[lVar3]];
    bc.bc[lVar3 + 3] = rhoydot_bc[NavierStokesBase::phys_bc.bc[lVar3 + 3]];
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
    std::operator+(&local_218,"I_R[rhoY(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((spec_names_abi_cxx11_.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2))
    ;
    std::operator+(&name,&local_218,")]");
    std::__cxx11::string::~string((string *)&local_218);
    indx = RhoYdot_Type;
    std::__cxx11::string::string((string *)&local_218,name._M_dataplus._M_p,&local_239);
    amrex::DescriptorList::setComponent
              ((DescriptorList *)amrex::AmrLevel::desc_lst,indx,(int)lVar3,&local_218,&bc,
               &pelelm_bndryfunc,(InterpBase *)amrex::eb_mf_cell_cons_interp,0,8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&name);
    lVar2 = lVar2 + 0x20;
  }
  amrex::StateDescriptor::BndryFunc::~BndryFunc(&pelelm_bndryfunc);
  return;
}

Assistant:

void
PeleLM::rhoydotSetUp()
{
  RhoYdot_Type       = desc_lst.size();
  const int ngrow = 1;
  int nrhoydot = NUM_SPECIES;

  amrex::Print() << "RhoYdot_Type, nrhoydot = " << RhoYdot_Type << ' ' << nrhoydot << '\n';

  desc_lst.addDescriptor(RhoYdot_Type,IndexType::TheCellType(),
                         StateDescriptor::Point,ngrow,nrhoydot,
                         &cc_interp);


  amrex::StateDescriptor::BndryFunc pelelm_bndryfunc(pelelm_dummy_fill);
  pelelm_bndryfunc.setRunOnGPU(true);  // I promise the bc function will launch gpu kernels.

	
  //const StateDescriptor& d_cell = desc_lst[State_Type];

  BCRec bc;	
  set_rhoydot_bc(bc,phys_bc);
  for (int i = 0; i < nrhoydot; i++)
  {
    const std::string name = "I_R[rhoY("+spec_names[i]+")]";
    desc_lst.setComponent(RhoYdot_Type, i, name.c_str(), bc,
                          pelelm_bndryfunc, &cc_interp, 0, nrhoydot-1);
  }
}